

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O2

void Bdc_SpfdDecomposeTest(void)

{
  Vec_Wrd_t *p;
  word wVar1;
  Vec_Wrd_t *p_00;
  abctime aVar2;
  word wVar3;
  abctime aVar4;
  abctime time;
  abctime time_00;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  Aig_ManRandom64(1);
  iVar5 = 0x4000000;
  p = Vec_WrdAlloc(0x4000000);
  while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
    wVar1 = Aig_ManRandom64(0);
    Vec_WrdPush(p,wVar1);
  }
  iVar5 = 8;
  p_00 = Vec_WrdAlloc(8);
  while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
    wVar1 = Aig_ManRandom64(0);
    Vec_WrdPush(p_00,wVar1);
  }
  aVar2 = Abc_Clock();
  iVar6 = 0;
  iVar5 = p->nSize;
  if (p->nSize < 1) {
    iVar5 = 0;
  }
  uVar7 = 0;
  for (; iVar6 != iVar5; iVar6 = iVar6 + 1) {
    wVar1 = Vec_WrdEntry(p,iVar6);
    iVar8 = 0;
    iVar9 = p_00->nSize;
    if (p_00->nSize < 1) {
      iVar9 = 0;
    }
    for (; iVar9 != iVar8; iVar8 = iVar8 + 1) {
      wVar3 = Vec_WrdEntry(p_00,iVar8);
      uVar7 = uVar7 + (((uint)wVar3 & ~(uint)wVar1) == 0);
    }
  }
  iVar9 = 0;
  printf("Total = %8d.  ",(ulong)uVar7);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x77b9b0,(char *)(aVar4 - aVar2),time);
  aVar2 = Abc_Clock();
  iVar6 = p_00->nSize;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  uVar7 = 0;
  for (; iVar9 != iVar6; iVar9 = iVar9 + 1) {
    wVar1 = Vec_WrdEntry(p_00,iVar9);
    for (iVar8 = 0; iVar5 != iVar8; iVar8 = iVar8 + 1) {
      wVar3 = Vec_WrdEntry(p,iVar8);
      uVar7 = uVar7 + (((uint)wVar3 & (uint)wVar1) == (uint)wVar1);
    }
  }
  printf("Total = %8d.  ",(ulong)uVar7);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x77b9b0,(char *)(aVar4 - aVar2),time_00);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest()
{
  int nSizeM = (1 << 26);  // big array size
  int nSizeK = (1 << 3);   // small array size
  Vec_Wrd_t * v1M, * v1K;
  int EntryM, EntryK;
  int i, k, Counter;
  abctime clk;

  Aig_ManRandom64( 1 );

  v1M = Vec_WrdAlloc( nSizeM );
  for ( i = 0; i < nSizeM; i++ )
      Vec_WrdPush( v1M, Aig_ManRandom64(0) );

  v1K = Vec_WrdAlloc( nSizeK );
  for ( i = 0; i < nSizeK; i++ )
      Vec_WrdPush( v1K, Aig_ManRandom64(0) );

  clk = Abc_Clock();
  Counter = 0;
//  for ( i = 0; i < nSizeM; i++ )
//  for ( k = 0; k < nSizeK; k++ )
//      Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
  Vec_WrdForEachEntry( v1M, EntryM, i )
  Vec_WrdForEachEntry( v1K, EntryK, k )
      Counter += ((EntryM & EntryK) == EntryK);
  printf( "Total = %8d.  ", Counter );
  Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

  clk = Abc_Clock();
  Counter = 0;
//  for ( k = 0; k < nSizeK; k++ )
//  for ( i = 0; i < nSizeM; i++ )
//      Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
  Vec_WrdForEachEntry( v1K, EntryK, k )
  Vec_WrdForEachEntry( v1M, EntryM, i )
      Counter += ((EntryM & EntryK) == EntryK);
  printf( "Total = %8d.  ", Counter );
  Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}